

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall QXmlStreamReaderPrivate::parseEntity(QXmlStreamReaderPrivate *this,QString *value)

{
  unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_> *this_00;
  undefined1 *puVar1;
  QXmlStreamReader *q;
  long lVar2;
  QXmlStreamReaderPrivate *pQVar3;
  uint *__ptr;
  long lVar4;
  long lVar5;
  QXmlStreamReaderPrivate *this_01;
  pointer __p;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((value->d).size != 0) {
    this_00 = &this->entityParser;
    pQVar3 = (this->entityParser)._M_t.
             super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
             .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
    if (pQVar3 == (QXmlStreamReaderPrivate *)0x0) {
      q = this->q_ptr;
      pQVar3 = (QXmlStreamReaderPrivate *)operator_new(0x410);
      QXmlStreamReaderPrivate(pQVar3,q);
      local_48.d.d = (Data *)0x0;
      std::__uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
      reset((__uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
             *)this_00,pQVar3);
      std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
      ~unique_ptr((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                   *)&local_48);
    }
    else {
      init(pQVar3,(EVP_PKEY_CTX *)value);
    }
    puVar1 = &((this_00->_M_t).
               super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
               .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl)->field_0x3a8;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x80;
    QString::operator=(&((this_00->_M_t).
                         super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
                         .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl)->
                        readBuffer,value);
    pQVar3 = (this_00->_M_t).
             super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
             .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
    __ptr = (pQVar3->putStack).data;
    lVar5 = (pQVar3->putStack).tos;
    lVar4 = lVar5 + 1;
    lVar2 = (pQVar3->putStack).cap;
    this_01 = pQVar3;
    if (lVar2 <= lVar4) {
      lVar5 = lVar5 + 2;
      lVar4 = lVar2 * 2;
      if (lVar5 != lVar4 && SBORROW8(lVar5,lVar4) == lVar5 + lVar2 * -2 < 0) {
        lVar4 = lVar5;
      }
      (pQVar3->putStack).cap = lVar4;
      __ptr = (uint *)realloc(__ptr,lVar4 << 2);
      (pQVar3->putStack).data = __ptr;
      if (__ptr == (uint *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          qBadAlloc();
        }
        goto LAB_00392e2c;
      }
      lVar4 = (pQVar3->putStack).tos + 1;
      this_01 = (this_00->_M_t).
                super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                ._M_t.
                super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
                .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
    }
    (pQVar3->putStack).tos = lVar4;
    __ptr[lVar4] = 0x2c0000;
    if (this_01->atEnd == false) {
      do {
        if (this_01->type == Invalid) break;
        parse(this_01);
        this_01 = (this_00->_M_t).
                  super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
                  .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
      } while (this_01->atEnd != true);
    }
    if ((this_01->type == Invalid) ||
       ((this_01->super_QXmlStreamPrivateTagStack).tagStack.tos != -1)) {
      QCoreApplication::translate(&local_48,"QXmlStream","Invalid entity value.",(char *)0x0,-1);
      this->error = NotWellFormedError;
      QString::operator=(&this->errorString,&local_48);
      this->type = Invalid;
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00392e2c:
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::parseEntity(const QString &value)
{
    Q_Q(QXmlStreamReader);

    if (value.isEmpty())
        return;


    if (!entityParser)
        entityParser = std::make_unique<QXmlStreamReaderPrivate>(q);
    else
        entityParser->init();
    entityParser->inParseEntity = true;
    entityParser->readBuffer = value;
    entityParser->injectToken(PARSE_ENTITY);
    while (!entityParser->atEnd && entityParser->type != QXmlStreamReader::Invalid)
        entityParser->parse();
    if (entityParser->type == QXmlStreamReader::Invalid || entityParser->tagStack.size())
        raiseWellFormedError(QXmlStream::tr("Invalid entity value."));

}